

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O2

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::visitExpr
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this,CallExpression *expr)

{
  __index_type _Var1;
  pointer ppEVar2;
  Expression *this_00;
  long *plVar3;
  char cVar4;
  long lVar5;
  long lVar6;
  
  ast::CallExpression::visitExprsNoArgs<slang::analysis::DataFlowAnalysis&>
            (expr,(DataFlowAnalysis *)this);
  _Var1 = *(__index_type *)
           ((long)&(expr->subroutine).
                   super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                   .
                   super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                   .
                   super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                   .
                   super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                   .
                   super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                   .
                   super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
           + 0x30);
  ppEVar2 = (expr->arguments_)._M_ptr;
  lVar5 = (expr->arguments_)._M_extent._M_extent_value << 3;
  lVar6 = 0;
  do {
    if (lVar5 == 0) {
      if ((_Var1 == '\x01') &&
         (*(char *)(*(long *)&(expr->subroutine).
                              super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                              .
                              super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                              .
                              super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                              .
                              super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                              .
                              super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                              .
                              super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                              ._M_u + 0x31) == '\x01')) {
        setUnreachable(this);
        return;
      }
      return;
    }
    this_00 = ppEVar2[lVar6];
    if (_Var1 == '\x01') {
      plVar3 = *(long **)&(expr->subroutine).
                          super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          .
                          super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          .
                          super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          .
                          super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          .
                          super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          .
                          super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          ._M_u;
      cVar4 = (**(code **)(*plVar3 + 0x20))(plVar3,lVar6);
      if (cVar4 == '\0') goto LAB_0032d7aa;
    }
    else {
LAB_0032d7aa:
      ast::Expression::visit<slang::analysis::DataFlowAnalysis&>(this_00,(DataFlowAnalysis *)this);
    }
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + -8;
  } while( true );
}

Assistant:

void visitExpr(const CallExpression& expr) {
        expr.visitExprsNoArgs(DERIVED);

        auto sysCall = std::get_if<CallExpression::SystemCallInfo>(&expr.subroutine);
        size_t argIndex = 0;
        for (auto arg : expr.arguments()) {
            if (!sysCall || !sysCall->subroutine->isArgUnevaluated(argIndex))
                visit(*arg);
            argIndex++;
        }

        if (sysCall && sysCall->subroutine->neverReturns)
            setUnreachable();
    }